

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O3

int cfd::capi::SetLastFatalError(void *handle,char *message)

{
  CfdCapiManager::SetLastError((CfdCapiManager *)handle,handle,-1,message);
  return 0;
}

Assistant:

int SetLastFatalError(void* handle, const char* message) {
  try {
    cfd::capi::capi_instance.SetLastFatalError(handle, message);
    return kCfdSuccess;
  } catch (const CfdException& except) {
    return except.GetErrorCode();
  } catch (...) {
    return kCfdUnknownError;
  }
}